

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O2

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_Byte *pFVar5;
  long lVar6;
  undefined1 *puVar7;
  FT_Bool FVar8;
  FT_Error FVar9;
  uint uVar10;
  FT_PtrDist offset;
  FT_Pointer pvVar11;
  FT_Long FVar12;
  ulong uVar13;
  uint uVar14;
  FT_Byte **ppFVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  FT_Error local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  FVar8 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar8 != '\0') &&
     (FVar9 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar9 != 0)) {
    return FVar9;
  }
  local_48 = cff_parse_num(parser,parser->top + -1);
  uVar17 = (uint)local_48;
  if (parser->stackSize < uVar17) {
    return 3;
  }
  local_58 = 0;
  uVar10 = *(int *)(lVar2 + 0x440) * uVar17;
  uVar14 = (uint)((ulong)((long)parser->top + (-8 - (long)parser->stack)) >> 3);
  local_50 = (ulong)(uVar14 - uVar10);
  FVar9 = 0xa1;
  if (uVar10 <= uVar14) {
    iVar16 = uVar17 * 5;
    uVar10 = *(uint *)(lVar2 + 0x470);
    uVar14 = *(uint *)(lVar2 + 0x474);
    if (uVar14 < uVar10 + iVar16) {
      pFVar3 = *(FT_Byte **)(lVar2 + 0x460);
      pFVar4 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar11 = ft_mem_qrealloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar14,
                                (ulong)(uVar14 + iVar16),pFVar3,&local_58);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar11;
      FVar9 = local_58;
      if (local_58 != 0) goto LAB_001e917e;
      uVar10 = *(uint *)(lVar2 + 0x470);
      *(ulong *)(lVar2 + 0x468) = (ulong)uVar10 + (long)pvVar11;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar16;
      if ((pFVar3 != (FT_Byte *)0x0) && ((long)pvVar11 - (long)pFVar3 != 0)) {
        for (ppFVar15 = parser->stack; ppFVar15 < parser->top; ppFVar15 = ppFVar15 + 1) {
          pFVar5 = *ppFVar15;
          if ((pFVar3 <= pFVar5) && (pFVar5 < pFVar4)) {
            *ppFVar15 = pFVar5 + ((long)pvVar11 - (long)pFVar3);
          }
        }
      }
    }
    *(uint *)(lVar2 + 0x470) = uVar10 + iVar16;
    uVar17 = (int)local_50 + uVar17;
    local_48 = local_48 & 0xffffffff;
    local_54 = uVar17;
    for (local_38 = 0; local_38 != local_48; local_38 = local_38 + 1) {
      lVar6 = *(long *)(lVar2 + 0x448);
      local_40 = (ulong)(uint)((int)local_50 + (int)local_38);
      FVar12 = cff_parse_num(parser,parser->stack + local_40);
      iVar16 = (int)FVar12 << 0x10;
      for (lVar18 = 1; (uint)lVar18 < *(uint *)(lVar2 + 0x440); lVar18 = lVar18 + 1) {
        uVar13 = (ulong)uVar17;
        uVar17 = uVar17 + 1;
        FVar12 = cff_parse_num(parser,parser->stack + uVar13);
        iVar16 = (int)FVar12 * *(int *)(lVar6 + lVar18 * 4) + iVar16;
      }
      pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
      parser->stack[local_40] = pFVar3;
      *(FT_Byte **)(lVar2 + 0x468) = pFVar3 + 1;
      *pFVar3 = 0xff;
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar16 >> 0x18);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar16 >> 0x10);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar16 >> 8);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)iVar16;
    }
    parser->top = parser->stack + local_54;
    FVar9 = local_58;
  }
LAB_001e917e:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return FVar9;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }